

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int put_dir(mg_connection *conn,char *path)

{
  int iVar1;
  ulong __n;
  int local_105c;
  int res;
  size_t len;
  mg_file file;
  char *p;
  char *s;
  char buf [4096];
  char *path_local;
  mg_connection *conn_local;
  
  buf._4088_8_ = path;
  memset(&len,0,0x28);
  local_105c = 1;
  p = (char *)(buf._4088_8_ + 2);
  while( true ) {
    file.access.fp = (FILE *)p;
    file.access.fp = (FILE *)strchr(p,0x2f);
    if (file.access.fp == (FILE *)0x0) {
      return local_105c;
    }
    __n = (long)file.access.fp - buf._4088_8_;
    if (0xfff < __n) break;
    memcpy(&s,(void *)buf._4088_8_,__n);
    buf[__n - 8] = '\0';
    iVar1 = mg_stat(conn,(char *)&s,(mg_file_stat *)&len);
    if ((iVar1 == 0) && (iVar1 = mkdir((char *)&s,0x1ed), iVar1 != 0)) {
      return -2;
    }
    if (*(char *)((long)&(file.access.fp)->_flags + 1) == '\0') {
      local_105c = 0;
    }
    p = (char *)((long)&(file.access.fp)->_flags + 1);
  }
  return -1;
}

Assistant:

static int
put_dir(struct mg_connection *conn, const char *path)
{
	char buf[UTF8_PATH_MAX];
	const char *s, *p;
	struct mg_file file = STRUCT_FILE_INITIALIZER;
	size_t len;
	int res = 1;

	for (s = p = path + 2; (p = strchr(s, '/')) != NULL; s = ++p) {
		len = (size_t)(p - path);
		if (len >= sizeof(buf)) {
			/* path too long */
			res = -1;
			break;
		}
		memcpy(buf, path, len);
		buf[len] = '\0';

		/* Try to create intermediate directory */
		DEBUG_TRACE("mkdir(%s)", buf);
		if (!mg_stat(conn, buf, &file.stat) && mg_mkdir(conn, buf, 0755) != 0) {
			/* path does not exist and can not be created */
			res = -2;
			break;
		}

		/* Is path itself a directory? */
		if (p[1] == '\0') {
			res = 0;
		}
	}

	return res;
}